

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmainwindow.cpp
# Opt level: O2

void QMainWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSize *iconSize;
  TabShape *pTVar1;
  bool bVar2;
  byte bVar3;
  TabShape TVar4;
  undefined1 uVar5;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      iconSizeChanged((QMainWindow *)_o,(QSize *)_a[1]);
      return;
    case 1:
      toolButtonStyleChanged((QMainWindow *)_o,*_a[1]);
      return;
    case 2:
      tabifiedDockWidgetActivated((QMainWindow *)_o,*_a[1]);
      return;
    case 3:
      uVar5 = *_a[1];
LAB_003fc7c3:
      setAnimated((QMainWindow *)_o,(bool)uVar5);
      return;
    case 4:
      uVar5 = *_a[1];
LAB_003fc7dd:
      setDockNestingEnabled((QMainWindow *)_o,(bool)uVar5);
      return;
    }
    break;
  case ReadProperty:
    if (7 < (uint)_id) {
      return;
    }
    pTVar1 = (TabShape *)*_a;
    switch(_id) {
    case 0:
      *(undefined8 *)pTVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0x268);
      return;
    case 1:
      TVar4 = *(TabShape *)(*(long *)(_o + 8) + 0x274);
      break;
    case 2:
      bVar3 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x700);
      goto LAB_003fc844;
    case 3:
      bVar2 = documentMode((QMainWindow *)_o);
      goto LAB_003fc846;
    case 4:
      TVar4 = tabShape((QMainWindow *)_o);
      break;
    case 5:
      bVar3 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x700) >> 1;
LAB_003fc844:
      bVar2 = (bool)(bVar3 & 1);
LAB_003fc846:
      *(bool *)pTVar1 = bVar2;
      return;
    case 6:
      TVar4 = *(TabShape *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x700);
      break;
    case 7:
      *(undefined1 *)pTVar1 = Rounded;
      return;
    }
    *pTVar1 = TVar4;
    break;
  case WriteProperty:
    if ((uint)_id < 7) {
      iconSize = (QSize *)*_a;
      switch(_id) {
      case 0:
        setIconSize((QMainWindow *)_o,iconSize);
        return;
      case 1:
        setToolButtonStyle((QMainWindow *)_o,(iconSize->wd).m_i);
        return;
      case 2:
        uVar5 = (undefined1)(iconSize->wd).m_i;
        break;
      case 3:
        setDocumentMode((QMainWindow *)_o,SUB41((iconSize->wd).m_i,0));
        return;
      case 4:
        setTabShape((QMainWindow *)_o,(iconSize->wd).m_i);
        return;
      case 5:
        uVar5 = (undefined1)(iconSize->wd).m_i;
        goto LAB_003fc7dd;
      case 6:
        setDockOptions((QMainWindow *)_o,(DockOptions)(iconSize->wd).m_i);
        return;
      }
      goto LAB_003fc7c3;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QMainWindow::*)(QSize_const&)>
                      ((QtMocHelpers *)_a,(void **)iconSizeChanged,0,0);
    if ((!bVar2) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QMainWindow::*)(Qt::ToolButtonStyle)>
                          ((QtMocHelpers *)_a,(void **)toolButtonStyleChanged,0,1), !bVar2)) {
      QtMocHelpers::indexOfMethod<void(QMainWindow::*)(QDockWidget*)>
                ((QtMocHelpers *)_a,(void **)tabifiedDockWidgetActivated,0,2);
      return;
    }
  }
  return;
}

Assistant:

void QMainWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMainWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->iconSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 1: _t->toolButtonStyleChanged((*reinterpret_cast< std::add_pointer_t<Qt::ToolButtonStyle>>(_a[1]))); break;
        case 2: _t->tabifiedDockWidgetActivated((*reinterpret_cast< std::add_pointer_t<QDockWidget*>>(_a[1]))); break;
        case 3: _t->setAnimated((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->setDockNestingEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setUnifiedTitleAndToolBarOnMac((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(const QSize & )>(_a, &QMainWindow::iconSizeChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(Qt::ToolButtonStyle )>(_a, &QMainWindow::toolButtonStyleChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(QDockWidget * )>(_a, &QMainWindow::tabifiedDockWidgetActivated, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 1: *reinterpret_cast<Qt::ToolButtonStyle*>(_v) = _t->toolButtonStyle(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isAnimated(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 4: *reinterpret_cast<QTabWidget::TabShape*>(_v) = _t->tabShape(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isDockNestingEnabled(); break;
        case 6: QtMocHelpers::assignFlags<DockOptions>(_v, _t->dockOptions()); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->unifiedTitleAndToolBarOnMac(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 1: _t->setToolButtonStyle(*reinterpret_cast<Qt::ToolButtonStyle*>(_v)); break;
        case 2: _t->setAnimated(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setTabShape(*reinterpret_cast<QTabWidget::TabShape*>(_v)); break;
        case 5: _t->setDockNestingEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setDockOptions(*reinterpret_cast<DockOptions*>(_v)); break;
        case 7: _t->setUnifiedTitleAndToolBarOnMac(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}